

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

bool __thiscall
pybind11::detail::copyable_holder_caster<anurbs::BrepEdge,_std::shared_ptr<anurbs::BrepEdge>_>::
load_value(copyable_holder_caster<anurbs::BrepEdge,_std::shared_ptr<anurbs::BrepEdge>_> *this,
          value_and_holder *v_h)

{
  void **ppvVar1;
  element_type *peVar2;
  byte bVar3;
  runtime_error *this_00;
  long *plVar4;
  long *plVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  bVar3 = v_h->inst->field_0x30;
  if ((bVar3 & 2) == 0) {
    bVar3 = (v_h->inst->field_1).nonsimple.status[v_h->index];
  }
  else {
    bVar3 = bVar3 >> 2;
  }
  if ((bVar3 & 1) != 0) {
    ppvVar1 = v_h->vh;
    peVar2 = (element_type *)ppvVar1[1];
    (this->super_type_caster_base<anurbs::BrepEdge>).super_type_caster_generic.value = *ppvVar1;
    (this->holder).super___shared_ptr<anurbs::BrepEdge,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->holder).super___shared_ptr<anurbs::BrepEdge,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(ppvVar1 + 2));
    return true;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  type_id<std::shared_ptr<anurbs::BrepEdge>>();
  std::operator+(&local_40,
                 "Unable to cast from non-held to held instance (T& to Holder<T>) of type \'",
                 &local_80);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_40);
  local_60 = (long *)*plVar4;
  plVar5 = plVar4 + 2;
  if (local_60 == plVar5) {
    local_50 = *plVar5;
    lStack_48 = plVar4[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar5;
  }
  local_58 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)&local_60);
  *(undefined ***)this_00 = &PTR__runtime_error_0036fcf0;
  __cxa_throw(this_00,&cast_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool holder_constructed() const {
        return inst->simple_layout
            ? inst->simple_holder_constructed
            : inst->nonsimple.status[index] & instance::status_holder_constructed;
    }